

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O0

void __thiscall
slang::ast::SFormat::TypeVisitor::visit<slang::ast::ErrorType>
          (TypeVisitor *this,ErrorType *param_2,ConstantValue *arg)

{
  string_view str;
  string_view str_00;
  ConstantValue *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  size_t in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  ConstantValue *in_stack_ffffffffffffff38;
  FormatBuffer *in_stack_ffffffffffffff40;
  FormatBuffer *this_02;
  char *in_stack_ffffffffffffff50;
  ConstantValue *in_stack_ffffffffffffffa8;
  
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 8);
    slang::ConstantValue::toString_abi_cxx11_
              (in_stack_ffffffffffffff38,(bitwidth_t)((ulong)this_01 >> 0x20),
               SUB81((ulong)this_01 >> 0x18,0),SUB81((ulong)this_01 >> 0x10,0));
    std::__cxx11::string::operator_cast_to_basic_string_view(this_01);
    str_00._M_str = in_stack_ffffffffffffff50;
    str_00._M_len = in_RDI;
    FormatBuffer::append(in_stack_ffffffffffffff40,str_00);
    std::__cxx11::string::~string(this_01);
  }
  else {
    this_00 = (ConstantValue *)(in_RDI + 8);
    this_02 = (FormatBuffer *)&stack0xffffffffffffff90;
    slang::ConstantValue::convertToStr(in_stack_ffffffffffffffa8);
    slang::ConstantValue::toString_abi_cxx11_
              (this_00,(bitwidth_t)((ulong)in_stack_ffffffffffffff30 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff30 >> 0x18,0),
               SUB81((ulong)in_stack_ffffffffffffff30 >> 0x10,0));
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
    str._M_str = in_stack_ffffffffffffff50;
    str._M_len = in_RDI;
    FormatBuffer::append(this_02,str);
    std::__cxx11::string::~string(in_stack_ffffffffffffff30);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x92aa4a);
  }
  return;
}

Assistant:

void visit(const T&, const ConstantValue& arg) {
        if (isStringLiteral)
            buffer.append(arg.convertToStr().toString());
        else
            buffer.append(arg.toString());
    }